

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O2

int find_insn_pattern(gen_ctx_t gen_ctx,MIR_insn_t insn,int *size)

{
  byte *pbVar1;
  longdouble lVar2;
  MIR_reg_t MVar3;
  VARR_insn_pattern_info_t *pVVar4;
  insn_pattern_info_t iVar5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  float fVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  byte *pbVar20;
  byte *pbVar21;
  ulong uVar22;
  MIR_op_t *op;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  byte bVar26;
  double local_48;
  
  pVVar4 = gen_ctx->target_ctx->insn_pattern_info;
  if (((pVVar4 == (VARR_insn_pattern_info_t *)0x0) || (pVVar4->varr == (insn_pattern_info_t *)0x0))
     || (pVVar4->els_num <= (ulong)*(uint *)&insn->field_0x18)) {
    mir_varr_assert_fail("get","insn_pattern_info_t");
  }
  iVar5 = pVVar4->varr[*(uint *)&insn->field_0x18];
  uVar23 = 0;
  uVar6 = iVar5.num;
LAB_00140dab:
  if (uVar23 == (~((int)uVar6 >> 0x1f) & uVar6)) {
    return -1;
  }
  iVar9 = VARR_intget(gen_ctx->target_ctx->pattern_indexes,(long)iVar5.start + uVar23);
  sVar12 = MIR_insn_nops(gen_ctx->ctx,insn);
  pbVar20 = (byte *)patterns[iVar9].pattern;
  uVar22 = 0;
LAB_00140df1:
  bVar8 = *pbVar20;
  if (bVar8 == 0) {
    if (uVar22 != sVar12) {
      __assert_fail("nop == nops",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x831,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    }
LAB_001413d8:
    if (size == (int *)0x0) {
      return iVar9;
    }
    *size = patterns[iVar9].max_insn_size;
    return iVar9;
  }
  while ((bVar8 == 9 || (uVar17 = (ulong)bVar8, bVar8 == 0x20))) {
    pbVar21 = pbVar20 + 1;
    pbVar20 = pbVar20 + 1;
    bVar8 = *pbVar21;
  }
  if (bVar8 == 0x24) goto LAB_001413d8;
  if (sVar12 <= uVar22 && 0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) goto LAB_001413b4;
  if (uVar22 == sVar12) {
    __assert_fail("nop < nops",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x788,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
  }
  op = insn->ops + uVar22;
  if (bVar8 - 0x30 < 10) {
    if (uVar22 <= uVar17 - 0x30) {
      __assert_fail("n < nop",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x80f,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    }
    lVar13 = uVar17 * 0x30;
    bVar8 = *(byte *)((long)insn + lVar13 + -0x8d8);
    lVar2 = *(longdouble *)((long)insn + lVar13 + -0x8d0);
    bVar26 = op->field_0x8;
    local_48 = SUB108(lVar2,0);
    if (bVar26 == 4) {
      bVar26 = 3;
    }
    if (bVar8 == bVar26) {
      MVar3 = *(MIR_reg_t *)((long)insn + lVar13 + -0x8bc);
      fVar10 = SUB104(lVar2,0);
      if ((bVar26 & 0xfe) != 2) {
        switch(bVar26) {
        case 5:
          goto switchD_00140f49_caseD_5;
        case 6:
          goto switchD_00140f49_caseD_6;
        case 7:
          goto switchD_00140f49_caseD_7;
        default:
          __assert_fail("mode == MIR_OP_VAR || mode == MIR_OP_INT || mode == MIR_OP_FLOAT || mode == MIR_OP_DOUBLE || mode == MIR_OP_LDOUBLE || mode == MIR_OP_VAR_MEM || mode == MIR_OP_LABEL"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x817,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        case 0xb:
          goto switchD_00140f49_caseD_b;
        case 0xc:
          goto switchD_00140f49_caseD_3;
        }
      }
      switch(bVar26) {
      case 2:
        bVar25 = (float)(op->u).reg == fVar10;
        goto LAB_00140f76;
      case 3:
      case 0xc:
        goto switchD_00140f49_caseD_3;
      default:
        goto LAB_0014128e;
      case 5:
switchD_00140f49_caseD_5:
        bVar24 = NAN((op->u).f) || NAN(fVar10);
        bVar25 = (op->u).f == fVar10;
        break;
      case 6:
switchD_00140f49_caseD_6:
        bVar24 = NAN((op->u).d) || NAN(local_48);
        bVar25 = (op->u).d == local_48;
        break;
      case 7:
switchD_00140f49_caseD_7:
        bVar24 = NAN((op->u).ld) || NAN(lVar2);
        bVar25 = (op->u).ld == lVar2;
        break;
      case 0xb:
switchD_00140f49_caseD_b:
        if (((*(char *)&op->u == SUB101(lVar2,0)) &&
            ((op->u).mem.disp == *(long *)((long)insn + lVar13 + -0x8b8))) &&
           (((op->u).mem.base == insn[-0x1c].ops[uVar17 - 1].u.reg && ((op->u).mem.index == MVar3)))
           ) {
          if (MVar3 != 0xffffffff) {
            bVar25 = (op->u).mem.scale == (MIR_scale_t)((unkuint10)lVar2 >> 8);
            goto LAB_00140f76;
          }
          goto LAB_0014128e;
        }
        goto LAB_001413b4;
      }
      if ((bVar25) && (!bVar24)) goto LAB_0014128e;
      goto LAB_001413b4;
    }
    if ((bVar8 == 4) && (bVar26 == 3)) {
switchD_00140f49_caseD_3:
      bVar25 = (double)(op->u).i == local_48;
      goto LAB_00140f76;
    }
    goto LAB_001413b4;
  }
  switch(bVar8) {
  case 0x68:
    if (op->field_0x8 != '\x02') goto LAB_001413b4;
    bVar8 = pbVar20[1];
    if (9 < (byte)(bVar8 - 0x30)) {
      __assert_fail("\'0\' <= ch && ch <= \'9\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x798,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    }
    pbVar21 = pbVar20 + 2;
    pbVar1 = pbVar20 + 1;
    pbVar20 = pbVar20 + 2;
    MVar3 = (uint)bVar8 * 10 + -0x210 + (uint)*pbVar21;
    if (9 < (byte)(*pbVar21 - 0x30)) {
      pbVar20 = pbVar1;
      MVar3 = bVar8 - 0x30;
    }
    bVar25 = (op->u).reg == MVar3;
    break;
  case 0x69:
    if ((8 < (byte)op->field_0x8) || ((0x118U >> ((byte)op->field_0x8 & 0x1f) & 1) == 0))
    goto LAB_001413b4;
    bVar8 = pbVar20[1];
    if ((bVar8 & 0xfc) != 0x30) {
      __assert_fail("\'0\' <= ch && ch <= \'3\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                    ,0x7a9,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)"
                   );
    }
    pbVar20 = pbVar20 + 1;
    lVar13 = int_value(gen_ctx,op);
    if (bVar8 != 0x32) {
      if (bVar8 == 0x31) {
        lVar18 = (long)(short)lVar13;
      }
      else {
        if (bVar8 != 0x30) goto LAB_0014128e;
        lVar18 = (long)(char)lVar13;
      }
      goto LAB_001413ac;
    }
    bVar25 = (int)lVar13 == lVar13;
    break;
  case 0x6a:
  case 0x6b:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
switchD_00140e75_caseD_6a:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x82e,"int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
  case 0x6c:
    if ((size != (int *)0x0) || (op->field_0x8 != '\f')) goto LAB_001413b4;
    sVar14 = get_label_disp(gen_ctx,(MIR_insn_t)(op->u).ref);
    sVar15 = VARR_uint8_tlength(gen_ctx->target_ctx->result_code);
    lVar13 = sVar14 - sVar15;
    if (lVar13 < 0) {
      lVar13 = (lVar13 - patterns[iVar9].max_insn_size) + -4;
    }
    else {
      lVar13 = lVar13 + -2;
    }
    bVar25 = (char)lVar13 == lVar13;
    break;
  case 0x6d:
    bVar8 = pbVar20[1];
    if (bVar8 == 0x75) {
LAB_0014124d:
      bVar26 = bVar8 == 0x75;
      bVar25 = bVar8 == 0x73;
      bVar8 = pbVar20[2];
      pbVar21 = pbVar20 + 2;
LAB_001412dd:
      if ((bVar8 & 0xfc) != 0x30) {
        __assert_fail("\'0\' <= ch && ch <= \'3\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x7d8,
                      "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
      }
      bVar16 = bVar25 & bVar26;
      if (bVar8 == 0x32) {
        bVar26 = bVar26 | 4;
        bVar7 = 4;
      }
      else {
        if (bVar8 != 0x31) {
          if (bVar8 == 0x30) {
            bVar19 = 0x13;
            bVar8 = bVar19;
            if (bVar16 != 0) {
              bVar8 = 0;
            }
          }
          else {
            bVar26 = bVar26 | 6;
            bVar8 = 0x13;
            if (bVar16 != 0) {
              bVar8 = 6;
            }
            bVar19 = 0xb;
          }
          goto LAB_00141358;
        }
        bVar26 = bVar26 | 2;
        bVar7 = 2;
      }
      bVar19 = 0x13;
      bVar8 = bVar19;
      if (bVar16 != 0) {
        bVar8 = bVar7;
      }
    }
    else {
      pbVar21 = pbVar20 + 1;
      if (bVar8 == 0x66) {
        bVar26 = 8;
LAB_001412a2:
        bVar19 = 0x13;
        bVar8 = bVar19;
      }
      else {
        if (bVar8 != 0x6c) {
          if (bVar8 == 0x73) goto LAB_0014124d;
          bVar26 = true;
          if (bVar8 == 100) {
            bVar26 = 9;
            goto LAB_001412a2;
          }
          bVar25 = true;
          goto LAB_001412dd;
        }
        if (pbVar20[2] != 100) {
          __assert_fail("ch == \'d\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x7cd,
                        "int pattern_match_p(gen_ctx_t, const struct pattern *, MIR_insn_t, int)");
        }
        pbVar20 = pbVar20 + 2;
        pbVar21 = pbVar20;
        if (op->field_0x8 == '\x02') {
          bVar19 = 0x13;
          bVar26 = 10;
          bVar8 = bVar19;
          if (0x21 < (op->u).reg) goto LAB_0014128e;
        }
        else {
          bVar19 = 0x13;
          bVar26 = 10;
          bVar8 = bVar19;
        }
      }
    }
LAB_00141358:
    if (((op->field_0x8 != '\v') ||
        (((bVar16 = *(byte *)&op->u, bVar19 != bVar16 && (bVar26 != bVar16)) && (bVar8 != bVar16))))
       || (((op->u).mem.index != 0xffffffff &&
           ((uVar11 = (uint)(op->u).mem.scale, 8 < uVar11 || ((0x116U >> (uVar11 & 0x1f) & 1) == 0))
           )))) goto LAB_001413b4;
    lVar13 = (op->u).mem.disp;
    lVar18 = (long)(int)lVar13;
    pbVar20 = pbVar21;
LAB_001413ac:
    bVar25 = lVar18 == lVar13;
    break;
  case 0x72:
    bVar25 = op->field_0x8 == '\x02';
    break;
  case 0x73:
    if (((ushort)((byte)op->field_0x8 - 3) < 2) && ((op->u).u < 9)) {
      bVar25 = (0x116UL >> ((op->u).u & 0x3f) & 1) != 0;
      goto LAB_00141180;
    }
    goto LAB_001413b4;
  case 0x74:
    if (op->field_0x8 == '\x02') {
      bVar25 = (op->u).reg < 4;
LAB_00141180:
      if (bVar25) goto LAB_0014128e;
    }
    goto LAB_001413b4;
  case 0x7a:
    if (1 < (ushort)((byte)op->field_0x8 - 3)) goto LAB_001413b4;
    bVar25 = (op->u).i == 0;
    break;
  default:
    if ((bVar8 != 0x4c) && (bVar8 != 0x58)) {
      if (bVar8 != 99) goto switchD_00140e75_caseD_6a;
      lVar13 = 0;
      uVar17 = 0;
      while (lVar18 = lVar13 + 1, (int)(char)pbVar20[lVar18] - 0x30U < 10) {
        if (uVar17 >> 0x3c != 0) {
          __assert_fail("(res >> 60) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0x744,"uint64_t read_dec(const char **)");
        }
        lVar13 = lVar13 + 1;
        uVar17 = (ulong)((int)(char)pbVar20[lVar18] - 0x30U) + uVar17 * 10;
      }
      if (lVar13 == 0) {
        __assert_fail("p != *ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x747,"uint64_t read_dec(const char **)");
      }
      if (((ushort)((byte)op->field_0x8 - 3) < 2) && ((op->u).i == uVar17)) {
        pbVar20 = pbVar20 + lVar13;
        goto LAB_0014128e;
      }
      goto LAB_001413b4;
    }
    goto LAB_0014128e;
  }
LAB_00140f76:
  if (!bVar25) goto LAB_001413b4;
LAB_0014128e:
  pbVar20 = pbVar20 + 1;
  uVar22 = uVar22 + 1;
  goto LAB_00140df1;
LAB_001413b4:
  uVar23 = uVar23 + 1;
  goto LAB_00140dab;
}

Assistant:

static int find_insn_pattern (gen_ctx_t gen_ctx, MIR_insn_t insn, int *size) {
  int i, ind;
  const struct pattern *pat;
  insn_pattern_info_t info = VARR_GET (insn_pattern_info_t, insn_pattern_info, insn->code);

  for (i = 0; i < info.num; i++) {
    ind = VARR_GET (int, pattern_indexes, info.start + i);
    pat = &patterns[ind];
    if (pattern_match_p (gen_ctx, pat, insn, size == NULL)) {
      if (size != NULL) *size = patterns[ind].max_insn_size;
      return ind;
    }
  }
  return -1;
}